

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int check_router_keys(rtr_signature_seg *sig_segs,spki_table *table)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int unaff_R13D;
  char *__s;
  long in_FS_OFFSET;
  uint router_keys_len;
  spki_record *tmp_key;
  char ski_str [61];
  uint local_84;
  spki_record *local_80;
  char local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = (spki_record *)0x0;
  do {
    if (sig_segs == (rtr_signature_seg *)0x0) {
      unaff_R13D = 0;
      break;
    }
    local_84 = 0;
    iVar2 = spki_table_search_by_ski(table,sig_segs->ski,&local_80,&local_84);
    if (iVar2 == -1) {
      unaff_R13D = -1;
      bVar1 = false;
    }
    else if (local_84 == 0) {
      local_78[0x30] = '\0';
      local_78[0x31] = '\0';
      local_78[0x32] = '\0';
      local_78[0x33] = '\0';
      local_78[0x34] = '\0';
      local_78[0x35] = '\0';
      local_78[0x36] = '\0';
      local_78[0x37] = '\0';
      local_78[0x38] = '\0';
      local_78[0x39] = '\0';
      local_78[0x3a] = '\0';
      local_78[0x3b] = '\0';
      local_78[0x3c] = '\0';
      local_78[0x20] = '\0';
      local_78[0x21] = '\0';
      local_78[0x22] = '\0';
      local_78[0x23] = '\0';
      local_78[0x24] = '\0';
      local_78[0x25] = '\0';
      local_78[0x26] = '\0';
      local_78[0x27] = '\0';
      local_78[0x28] = '\0';
      local_78[0x29] = '\0';
      local_78[0x2a] = '\0';
      local_78[0x2b] = '\0';
      local_78[0x2c] = '\0';
      local_78[0x2d] = '\0';
      local_78[0x2e] = '\0';
      local_78[0x2f] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      local_78[0x18] = '\0';
      local_78[0x19] = '\0';
      local_78[0x1a] = '\0';
      local_78[0x1b] = '\0';
      local_78[0x1c] = '\0';
      local_78[0x1d] = '\0';
      local_78[0x1e] = '\0';
      local_78[0x1f] = '\0';
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      lVar3 = 8;
      __s = local_78;
      do {
        sprintf(__s,"%02X ",(ulong)sig_segs->ski[lVar3 + -8]);
        lVar3 = lVar3 + 1;
        __s = __s + 3;
      } while (lVar3 != 0x1c);
      bVar1 = false;
      lrtr_dbg("BGPSEC: ERROR: Could not find router key for SKI: %s",local_78);
      unaff_R13D = -4;
    }
    else {
      lrtr_free(local_80);
      sig_segs = sig_segs->next;
      bVar1 = true;
    }
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return unaff_R13D;
}

Assistant:

int check_router_keys(const struct rtr_signature_seg *sig_segs, struct spki_table *table)
{
	struct spki_record *tmp_key = NULL;
	const struct rtr_signature_seg *curr = sig_segs;

	while (curr) {
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, (uint8_t *)curr->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR)
			return RTR_BGPSEC_ERROR;

		/* Return an error, if a router key was not found. */
		if (router_keys_len == 0) {
			char ski_str[SKI_STR_LEN] = {0};

			ski_to_char(ski_str, (uint8_t *)curr->ski);
			BGPSEC_DBG("ERROR: Could not find router key for SKI: %s", ski_str);
			return RTR_BGPSEC_ROUTER_KEY_NOT_FOUND;
		}
		lrtr_free(tmp_key);
		curr = curr->next;
	}

	return RTR_BGPSEC_SUCCESS;
}